

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

void __thiscall
Assimp::Ogre::Bone::CalculateWorldMatrixAndDefaultPose(Bone *this,Skeleton *skeleton)

{
  uint16_t id;
  uint16_t *puVar1;
  aiMatrix4x4t<float> *paVar2;
  Bone *this_00;
  DeadlyImportError *this_01;
  ostream *poVar3;
  uint16_t *puVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  aiMatrix4x4t<float> aStack_1e8;
  aiMatrix4x4t<float> temp;
  
  if ((this->parentId == -1) || (this->parent == (Bone *)0x0)) {
    aiMatrix4x4t<float>::aiMatrix4x4t(&temp,&this->scale,&this->rotation,&this->position);
    paVar2 = aiMatrix4x4t<float>::Inverse(&temp);
    fVar5 = paVar2->a1;
    fVar6 = paVar2->a2;
    fVar7 = paVar2->a3;
    fVar8 = paVar2->a4;
    fVar9 = paVar2->b1;
    fVar10 = paVar2->b2;
    fVar11 = paVar2->b3;
    fVar12 = paVar2->b4;
    fVar13 = paVar2->c1;
    fVar14 = paVar2->c2;
    fVar15 = paVar2->c3;
    fVar16 = paVar2->c4;
    fVar17 = paVar2->d1;
    fVar18 = paVar2->d2;
    fVar19 = paVar2->d3;
    fVar20 = paVar2->d4;
  }
  else {
    aiMatrix4x4t<float>::aiMatrix4x4t(&aStack_1e8,&this->scale,&this->rotation,&this->position);
    paVar2 = aiMatrix4x4t<float>::Inverse(&aStack_1e8);
    temp.a1 = paVar2->a1;
    temp.a2 = paVar2->a2;
    temp.a3 = paVar2->a3;
    temp.a4 = paVar2->a4;
    temp.b1 = paVar2->b1;
    temp.b2 = paVar2->b2;
    temp.b3 = paVar2->b3;
    temp.b4 = paVar2->b4;
    temp.c1 = paVar2->c1;
    temp.c2 = paVar2->c2;
    temp.c3 = paVar2->c3;
    temp.c4 = paVar2->c4;
    temp.d1 = paVar2->d1;
    temp.d2 = paVar2->d2;
    temp.d3 = paVar2->d3;
    temp.d4 = paVar2->d4;
    aiMatrix4x4t<float>::operator*=(&temp,&this->parent->worldMatrix);
    fVar5 = temp.a1;
    fVar6 = temp.a2;
    fVar7 = temp.a3;
    fVar8 = temp.a4;
    fVar9 = temp.b1;
    fVar10 = temp.b2;
    fVar11 = temp.b3;
    fVar12 = temp.b4;
    fVar13 = temp.c1;
    fVar14 = temp.c2;
    fVar15 = temp.c3;
    fVar16 = temp.c4;
    fVar17 = temp.d1;
    fVar18 = temp.d2;
    fVar19 = temp.d3;
    fVar20 = temp.d4;
  }
  (this->worldMatrix).a1 = fVar5;
  (this->worldMatrix).a2 = fVar6;
  (this->worldMatrix).a3 = fVar7;
  (this->worldMatrix).a4 = fVar8;
  (this->worldMatrix).b1 = fVar9;
  (this->worldMatrix).b2 = fVar10;
  (this->worldMatrix).b3 = fVar11;
  (this->worldMatrix).b4 = fVar12;
  (this->worldMatrix).c1 = fVar13;
  (this->worldMatrix).c2 = fVar14;
  (this->worldMatrix).c3 = fVar15;
  (this->worldMatrix).c4 = fVar16;
  (this->worldMatrix).d1 = fVar17;
  (this->worldMatrix).d2 = fVar18;
  (this->worldMatrix).d3 = fVar19;
  (this->worldMatrix).d4 = fVar20;
  aiMatrix4x4t<float>::aiMatrix4x4t(&temp,&this->scale,&this->rotation,&this->position);
  (this->defaultPose).d1 = temp.d1;
  (this->defaultPose).d2 = temp.d2;
  (this->defaultPose).d3 = temp.d3;
  (this->defaultPose).d4 = temp.d4;
  (this->defaultPose).c1 = temp.c1;
  (this->defaultPose).c2 = temp.c2;
  (this->defaultPose).c3 = temp.c3;
  (this->defaultPose).c4 = temp.c4;
  (this->defaultPose).b1 = temp.b1;
  (this->defaultPose).b2 = temp.b2;
  (this->defaultPose).b3 = temp.b3;
  (this->defaultPose).b4 = temp.b4;
  (this->defaultPose).a1 = temp.a1;
  (this->defaultPose).a2 = temp.a2;
  (this->defaultPose).a3 = temp.a3;
  (this->defaultPose).a4 = temp.a4;
  puVar4 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->children).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar4 == puVar1) {
      return;
    }
    id = *puVar4;
    this_00 = Skeleton::BoneById(skeleton,id);
    if (this_00 == (Bone *)0x0) break;
    CalculateWorldMatrixAndDefaultPose(this_00,skeleton);
    puVar4 = puVar4 + 1;
  }
  this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&temp);
  std::operator<<((ostream *)&temp,"CalculateWorldMatrixAndDefaultPose: Failed to find child bone ")
  ;
  std::ostream::operator<<(&temp,id);
  std::operator<<((ostream *)&temp," for parent ");
  poVar3 = (ostream *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&temp,
                      &this->id);
  std::operator<<(poVar3," ");
  std::operator<<(poVar3,(string *)&this->name);
  std::__cxx11::stringbuf::str();
  DeadlyImportError::DeadlyImportError(this_01,(string *)&aStack_1e8);
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Bone::CalculateWorldMatrixAndDefaultPose(Skeleton *skeleton)
{
    if (!IsParented())
        worldMatrix = aiMatrix4x4(scale, rotation, position).Inverse();
    else
        worldMatrix = aiMatrix4x4(scale, rotation, position).Inverse() * parent->worldMatrix;

    defaultPose = aiMatrix4x4(scale, rotation, position);

    // Recursively for all children now that the parent matrix has been calculated.
    for (auto boneId : children)
    {
        Bone *child = skeleton->BoneById(boneId);
        if (!child) {
            throw DeadlyImportError(Formatter::format() << "CalculateWorldMatrixAndDefaultPose: Failed to find child bone " << boneId << " for parent " << id << " " << name);
        }
        child->CalculateWorldMatrixAndDefaultPose(skeleton);
    }
}